

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O2

Stereo __thiscall nh_ugens::RandomLFO::process(RandomLFO *this)

{
  Stereo SVar1;
  int iVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  iVar2 = this->m_timeout;
  if (iVar2 < 1) {
    iVar2 = (int)(((((float)(this->m_lcg_state * 0x15a4e35 + 1 >> 0x10) * 0.1) / this->m_frequency)
                  * this->m_sample_rate) / 48000.0);
    uVar3 = this->m_lcg_state * 0x7f2856f9 + 0x15a4e36;
    this->m_lcg_state = uVar3;
    fVar4 = (((float)(uVar3 >> 0x10) * 3.051851e-05 + -0.5) * this->m_frequency) /
            this->m_sample_rate;
    this->m_increment = fVar4;
  }
  else {
    fVar4 = this->m_increment;
  }
  this->m_timeout = iVar2 + -1;
  fVar4 = fVar4 + this->m_phase;
  this->m_phase = fVar4;
  fVar5 = sinf(fVar4);
  fVar4 = this->m_amplitude;
  fVar6 = cosf(this->m_phase);
  SVar1._M_elems[1] = this->m_amplitude * fVar6;
  SVar1._M_elems[0] = fVar4 * fVar5;
  return (Stereo)SVar1._M_elems;
}

Assistant:

Stereo process(void) {
        if (m_timeout <= 0) {
            m_timeout = run_lcg() * 0.1f / m_frequency * m_sample_rate / 48000.0f;
            m_increment = (run_lcg() * (1.0f / 32767.0f) - 0.5f) * m_frequency / m_sample_rate;
        }
        m_timeout -= 1;
        m_phase += m_increment;
        // TODO: optimize
        Stereo result = {{
            sinf(m_phase) * m_amplitude,
            cosf(m_phase) * m_amplitude
        }};
        return result;
    }